

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetA.c
# Opt level: O1

void point_add_proj(pt_prj_t_conflict2 *R,pt_prj_t_conflict2 *Q,pt_prj_t_conflict2 *P)

{
  uint64_t *arg1;
  uint64_t *arg2;
  uint64_t *out1;
  uint64_t *arg1_00;
  uint64_t *arg2_00;
  uint64_t uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint64_t *out1_00;
  uint64_t local_218;
  long lStack_210;
  long local_208;
  long lStack_200;
  long local_1f8;
  long lStack_1f0;
  long local_1e8;
  long lStack_1e0;
  long local_1d8;
  long lStack_1d0;
  uint64_t local_1c8;
  long lStack_1c0;
  long local_1b8;
  long lStack_1b0;
  long local_1a8;
  long lStack_1a0;
  long local_198;
  long lStack_190;
  long local_188;
  long lStack_180;
  uint64_t local_178;
  long lStack_170;
  long local_168;
  long lStack_160;
  long local_158;
  long lStack_150;
  long local_148;
  long lStack_140;
  long local_138;
  long lStack_130;
  uint64_t local_128;
  long lStack_120;
  long local_118;
  long lStack_110;
  long local_108;
  long lStack_100;
  long local_f8;
  long lStack_f0;
  long local_e8;
  long lStack_e0;
  uint64_t local_d8;
  long lStack_d0;
  long local_c8;
  long lStack_c0;
  long local_b8;
  long lStack_b0;
  long local_a8;
  long lStack_a0;
  long local_98;
  long lStack_90;
  uint64_t local_88;
  long lStack_80;
  long local_78;
  long lStack_70;
  long local_68;
  long lStack_60;
  long local_58;
  long lStack_50;
  long local_48;
  long lStack_40;
  
  arg1 = Q->Y;
  arg1_00 = Q->Z;
  arg2 = P->Y;
  arg2_00 = P->Z;
  out1 = R->Y;
  out1_00 = R->Z;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_d8,Q->X,P->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_128,arg1,arg2);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_1c8,arg1_00,arg2_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(&local_178,Q->X,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_178,&local_178);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(&local_218,P->X,arg2);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_218,&local_218);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_178,&local_178,&local_218);
  lVar10 = lStack_90;
  lVar9 = local_98;
  lVar8 = lStack_a0;
  lVar7 = local_a8;
  lVar6 = lStack_b0;
  lVar5 = local_b8;
  lVar4 = lStack_c0;
  lVar3 = local_c8;
  lVar2 = lStack_d0;
  uVar1 = local_d8;
  local_218 = local_d8 + local_128;
  lStack_210 = lStack_120 + lStack_d0;
  local_208 = local_118 + local_c8;
  lStack_200 = lStack_110 + lStack_c0;
  local_1f8 = local_108 + local_b8;
  lStack_1f0 = lStack_100 + lStack_b0;
  local_1e8 = local_f8 + local_a8;
  lStack_1e0 = lStack_f0 + lStack_a0;
  local_1d8 = local_e8 + local_98;
  lStack_1d0 = lStack_90 + lStack_e0;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_218,&local_218);
  local_178 = (local_178 - local_218) + 0x1ffffffffffb8e;
  lStack_170 = (lStack_170 - lStack_210) + 0xffffffffffffe;
  local_168 = (local_168 - local_208) + 0xffffffffffffe;
  lStack_160 = (lStack_160 - lStack_200) + 0xffffffffffffe;
  local_158 = (local_158 - local_1f8) + 0xffffffffffffe;
  lStack_150 = (lStack_150 - lStack_1f0) + 0x1ffffffffffffe;
  local_148 = (local_148 - local_1e8) + 0xffffffffffffe;
  lStack_140 = (lStack_140 - lStack_1e0) + 0xffffffffffffe;
  local_138 = (local_138 - local_1d8) + 0xffffffffffffe;
  lStack_130 = (lStack_130 - lStack_1d0) + 0xffffffffffffe;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_178,&local_178);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(&local_218,arg1,arg1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_218,&local_218);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(&local_88,arg2,arg2_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_88,&local_88);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_218,&local_218,&local_88);
  local_88 = local_128 + local_1c8;
  lStack_80 = lStack_120 + lStack_1c0;
  local_78 = local_118 + local_1b8;
  lStack_70 = lStack_110 + lStack_1b0;
  local_68 = local_108 + local_1a8;
  lStack_60 = lStack_100 + lStack_1a0;
  local_58 = local_f8 + local_198;
  lStack_50 = lStack_f0 + lStack_190;
  local_48 = local_e8 + local_188;
  lStack_40 = lStack_e0 + lStack_180;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_88,&local_88);
  local_218 = (local_218 - local_88) + 0x1ffffffffffb8e;
  lStack_210 = (lStack_210 - lStack_80) + 0xffffffffffffe;
  local_208 = (local_208 - local_78) + 0xffffffffffffe;
  lStack_200 = (lStack_200 - lStack_70) + 0xffffffffffffe;
  local_1f8 = (local_1f8 - local_68) + 0xffffffffffffe;
  lStack_1f0 = (lStack_1f0 - lStack_60) + 0x1ffffffffffffe;
  local_1e8 = (local_1e8 - local_58) + 0xffffffffffffe;
  lStack_1e0 = (lStack_1e0 - lStack_50) + 0xffffffffffffe;
  local_1d8 = (local_1d8 - local_48) + 0xffffffffffffe;
  lStack_1d0 = (lStack_1d0 - lStack_40) + 0xffffffffffffe;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_218,&local_218);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(R->X,Q->X,arg1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(R->X,R->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(out1,P->X,arg2_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(R->X,R->X,out1);
  R->Y[0] = uVar1 + local_1c8;
  R->Y[1] = lVar2 + lStack_1c0;
  R->Y[2] = lVar3 + local_1b8;
  R->Y[3] = lVar4 + lStack_1b0;
  R->Y[4] = lVar5 + local_1a8;
  R->Y[5] = lVar6 + lStack_1a0;
  R->Y[6] = lVar7 + local_198;
  R->Y[7] = lVar8 + lStack_190;
  R->Y[8] = lVar9 + local_188;
  R->Y[9] = lVar10 + lStack_180;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(out1,R->X,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(out1_00,const_b,&local_1c8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(R->X,out1,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(R->X,R->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(out1_00,R->X,R->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1_00,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(R->X,R->X,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(R->X,R->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(out1_00,&local_128,R->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1_00,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(R->X,&local_128,R->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(R->X,R->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(out1,const_b,out1);
  local_128 = local_1c8 * 2;
  lStack_120 = lStack_1c0 * 2;
  local_118 = local_1b8 * 2;
  lStack_110 = lStack_1b0 * 2;
  local_108 = local_1a8 * 2;
  lStack_100 = lStack_1a0 * 2;
  local_f8 = local_198 * 2;
  lStack_f0 = lStack_190 * 2;
  local_e8 = local_188 * 2;
  lStack_e0 = lStack_180 * 2;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_128,&local_128);
  local_1c8 = local_1c8 + local_128;
  lStack_1c0 = lStack_1c0 + lStack_120;
  local_1b8 = local_1b8 + local_118;
  lStack_1b0 = lStack_1b0 + lStack_110;
  local_1a8 = local_1a8 + local_108;
  lStack_1a0 = lStack_1a0 + lStack_100;
  local_198 = local_198 + local_f8;
  lStack_190 = lStack_190 + lStack_f0;
  local_188 = local_188 + local_e8;
  lStack_180 = lStack_180 + lStack_e0;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_1c8,&local_1c8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(out1,out1,&local_1c8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(out1,out1,&local_d8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(&local_128,out1,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_128,&local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(out1,&local_128,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1,out1);
  local_128 = local_d8 * 2;
  lStack_120 = lStack_d0 * 2;
  local_118 = local_c8 * 2;
  lStack_110 = lStack_c0 * 2;
  local_108 = local_b8 * 2;
  lStack_100 = lStack_b0 * 2;
  local_f8 = local_a8 * 2;
  lStack_f0 = lStack_a0 * 2;
  local_e8 = local_98 * 2;
  lStack_e0 = lStack_90 * 2;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_128,&local_128);
  local_d8 = local_d8 + local_128;
  lStack_d0 = lStack_d0 + lStack_120;
  local_c8 = local_c8 + local_118;
  lStack_c0 = lStack_c0 + lStack_110;
  local_b8 = local_b8 + local_108;
  lStack_b0 = lStack_b0 + lStack_100;
  local_a8 = local_a8 + local_f8;
  lStack_a0 = lStack_a0 + lStack_f0;
  local_98 = local_98 + local_e8;
  lStack_90 = lStack_90 + lStack_e0;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_d8,&local_d8);
  local_d8 = (local_d8 - local_1c8) + 0x1ffffffffffb8e;
  lStack_d0 = (lStack_d0 - lStack_1c0) + 0xffffffffffffe;
  local_c8 = (local_c8 - local_1b8) + 0xffffffffffffe;
  lStack_c0 = (lStack_c0 - lStack_1b0) + 0xffffffffffffe;
  local_b8 = (local_b8 - local_1a8) + 0xffffffffffffe;
  lStack_b0 = (lStack_b0 - lStack_1a0) + 0x1ffffffffffffe;
  local_a8 = (local_a8 - local_198) + 0xffffffffffffe;
  lStack_a0 = (lStack_a0 - lStack_190) + 0xffffffffffffe;
  local_98 = (local_98 - local_188) + 0xffffffffffffe;
  lStack_90 = (lStack_90 - lStack_180) + 0xffffffffffffe;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_d8,&local_d8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_128,&local_218,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_1c8,&local_d8,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(out1,R->X,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(out1,out1,&local_1c8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(R->X,&local_178,R->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(R->X,R->X,&local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(R->X,R->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(out1_00,&local_218,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_128,&local_178,&local_d8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(out1_00,out1_00,&local_128);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1_00,out1_00);
  return;
}

Assistant:

static void point_add_proj(pt_prj_t *R, const pt_prj_t *Q, const pt_prj_t *P) {
    /* temporary variables */
    fe_t t0, t1, t2, t3, t4, t5;
    /* constants */
    const limb_t *b = const_b;
    /* set pointers for legacy curve arith */
    const limb_t *X1 = Q->X;
    const limb_t *Y1 = Q->Y;
    const limb_t *Z1 = Q->Z;
    const limb_t *X2 = P->X;
    const limb_t *Y2 = P->Y;
    const limb_t *Z2 = P->Z;
    limb_t *X3 = R->X;
    limb_t *Y3 = R->Y;
    limb_t *Z3 = R->Z;

    /* the curve arith formula */
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t0, X1, X2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t1, Y1, Y2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t2, Z1, Z2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(t3, X1, Y1);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(t4, X2, Y2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t3, t3, t4);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(t4, t0, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_sub(t3, t3, t4);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(t4, Y1, Z1);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(t5, Y2, Z2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t4, t4, t5);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(t5, t1, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_sub(t4, t4, t5);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(X3, X1, Z1);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(Y3, X2, Z2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(X3, X3, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(Y3, t0, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_sub(Y3, X3, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(Z3, b, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_sub(X3, Y3, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(Z3, X3, X3);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(X3, X3, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_sub(Z3, t1, X3);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(X3, t1, X3);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(Y3, b, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(t1, t2, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(t2, t1, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_sub(Y3, Y3, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_sub(Y3, Y3, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(t1, Y3, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(Y3, t1, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(t1, t0, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(t0, t1, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_sub(t0, t0, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t1, t4, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t2, t0, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(Y3, X3, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(Y3, Y3, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(X3, t3, X3);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_sub(X3, X3, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(Z3, t4, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t1, t3, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_add(Z3, Z3, t1);
}